

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignumber.cpp
# Opt level: O2

BigNumber * __thiscall BigNumber::operator-=(BigNumber *this,BigNumber *other)

{
  BigNumber BStack_58;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,(string *)this);
  operator-(&BStack_58,(BigNumber *)local_38,other);
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::~string((string *)&BStack_58);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

BigNumber& BigNumber::operator-=(const BigNumber &other) {
    *this = *this - other;
    return *this;
}